

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_conversion.cpp
# Opt level: O0

string * skiwi::get_variable_name_before_alpha
                   (string *__return_storage_ptr__,string *variable_name_after_alpha)

{
  uint uVar1;
  long lVar2;
  bool local_91;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [2];
  undefined8 local_70;
  undefined8 local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  bool local_55;
  bool is_number;
  string local_48 [8];
  string alpha_index_nr;
  size_type pos;
  string *variable_name_after_alpha_local;
  string *name_before_alpha_conversion;
  
  lVar2 = std::__cxx11::string::find_last_of((char)variable_name_after_alpha,0x5f);
  alpha_index_nr.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)variable_name_after_alpha);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)variable_name_after_alpha);
    uVar1 = std::__cxx11::string::empty();
    local_91 = false;
    if ((uVar1 & 1) == 0) {
      local_68 = std::__cxx11::string::begin();
      local_70 = std::__cxx11::string::end();
      local_60 = std::
                 find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,skiwi::get_variable_name_before_alpha(std::__cxx11::string_const&)::__0>
                           (local_68,local_70);
      local_80[0]._M_current = (char *)std::__cxx11::string::end();
      local_91 = __gnu_cxx::operator==(&local_60,local_80);
    }
    local_55 = local_91;
    if (local_91 == false) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)variable_name_after_alpha);
    }
    std::__cxx11::string::~string(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_variable_name_before_alpha(const std::string& variable_name_after_alpha)
  {
  auto pos = variable_name_after_alpha.find_last_of('_');
  std::string name_before_alpha_conversion = variable_name_after_alpha.substr(0, pos);
  if (pos != std::string::npos)
    {
    std::string alpha_index_nr = variable_name_after_alpha.substr(pos + 1);
    bool is_number = !alpha_index_nr.empty() &&
      std::find_if(alpha_index_nr.begin(), alpha_index_nr.end(), [](char c) { return !std::isdigit(c); }) == alpha_index_nr.end();
    if (!is_number)
      name_before_alpha_conversion = variable_name_after_alpha;
    }
  return name_before_alpha_conversion;
  }